

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_functionBytecodeDirectCompiler_getBindingValue
          (sysbvm_context_t *context,sysbvm_functionBytecodeDirectCompiler_t *compiler,
          sysbvm_tuple_t binding)

{
  sysbvm_functionBytecodeAssembler_t *psVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  ulong uVar5;
  sysbvm_tuple_t sVar6;
  sysbvm_tuple_t value;
  sysbvm_tuple_t local_30;
  
  _Var2 = sysbvm_tuple_isKindOf(context,binding,(context->roots).symbolTupleSlotBindingType);
  if (_Var2) {
    sVar3 = sysbvm_functionBytecodeDirectCompiler_getBindingValue
                      (context,compiler,*(sysbvm_tuple_t *)(binding + 0x48));
    psVar1 = compiler->assembler;
    sVar4 = sysbvm_typeSlot_getValidReferenceType(context,*(sysbvm_tuple_t *)(binding + 0x50));
    sVar4 = sysbvm_functionBytecodeAssembler_newTemporary(context,psVar1,sVar4);
    uVar5 = *(ulong *)(*(long *)(binding + 0x48) + 0x30);
    if (((uVar5 & 0xf) == 0 && uVar5 != 0) && ((*(byte *)(uVar5 + 8) & 0x80) == 0)) {
      uVar5 = *(ulong *)(uVar5 + 0x70);
      if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
        uVar5 = (long)uVar5 >> 4;
      }
      else {
        uVar5 = *(ulong *)(uVar5 + 0x10);
      }
      if ((uVar5 & 0xe00) != 0) {
        psVar1 = compiler->assembler;
        sVar6 = sysbvm_functionBytecodeAssembler_addLiteral
                          (context,psVar1,*(sysbvm_tuple_t *)(binding + 0x50));
        sysbvm_functionBytecodeAssembler_refSlotReferenceAt(context,psVar1,sVar4,sVar3,sVar6);
        return sVar4;
      }
    }
    psVar1 = compiler->assembler;
    sVar6 = sysbvm_functionBytecodeAssembler_addLiteral
                      (context,psVar1,*(sysbvm_tuple_t *)(binding + 0x50));
    sysbvm_functionBytecodeAssembler_slotReferenceAt(context,psVar1,sVar4,sVar3,sVar6);
    local_30 = sVar4;
  }
  else {
    _Var2 = sysbvm_symbolBinding_isValue(context,binding);
    if (_Var2) {
      if ((binding & 0xf) == 0 && binding != 0) {
        sVar3 = *(sysbvm_tuple_t *)(binding + 0x30);
      }
      else {
        sVar3 = 0;
      }
      sVar3 = sysbvm_functionBytecodeAssembler_newTemporary(context,compiler->assembler,sVar3);
      sVar4 = sysbvm_functionBytecodeAssembler_addLiteral(context,compiler->assembler,binding);
      sysbvm_functionBytecodeAssembler_loadSymbolValueBinding
                (context,compiler->assembler,sVar3,sVar4);
      local_30 = sVar3;
    }
    else {
      local_30 = 0;
      _Var2 = sysbvm_methodDictionary_find(compiler->bindingDictionary,binding,&local_30);
      if (!_Var2) {
        sysbvm_error("Invalid value binding.");
      }
    }
  }
  return local_30;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeDirectCompiler_getBindingValue(sysbvm_context_t *context, sysbvm_functionBytecodeDirectCompiler_t *compiler, sysbvm_tuple_t binding)
{
    (void)context;
    if(sysbvm_tuple_isKindOf(context, binding, context->roots.symbolTupleSlotBindingType))
    {
        sysbvm_symbolTupleSlotBinding_t *bindingObject = (sysbvm_symbolTupleSlotBinding_t*)binding;
        sysbvm_tuple_t tupleValue = sysbvm_functionBytecodeDirectCompiler_getBindingValue(context, compiler, bindingObject->tupleBinding);
        sysbvm_tuple_t reference = sysbvm_functionBytecodeAssembler_newTemporary(context, compiler->assembler, sysbvm_typeSlot_getValidReferenceType(context, bindingObject->typeSlot));

        sysbvm_symbolBinding_t *tupleBindingObject = (sysbvm_symbolBinding_t*)bindingObject->tupleBinding;

        if(sysbvm_type_isPointerLikeType(tupleBindingObject->type))
            sysbvm_functionBytecodeAssembler_refSlotReferenceAt(context, compiler->assembler, reference, tupleValue, sysbvm_functionBytecodeAssembler_addLiteral(context, compiler->assembler, bindingObject->typeSlot));
        else
            sysbvm_functionBytecodeAssembler_slotReferenceAt(context, compiler->assembler, reference, tupleValue, sysbvm_functionBytecodeAssembler_addLiteral(context, compiler->assembler, bindingObject->typeSlot));
        return reference;
    }

    if(sysbvm_symbolBinding_isValue(context, binding))
    {
        sysbvm_tuple_t valueTemp = sysbvm_functionBytecodeAssembler_newTemporary(context, compiler->assembler, sysbvm_symbolBinding_getType(binding));
        sysbvm_tuple_t bindingLiteral = sysbvm_functionBytecodeAssembler_addLiteral(context, compiler->assembler, binding);
        sysbvm_functionBytecodeAssembler_loadSymbolValueBinding(context, compiler->assembler, valueTemp, bindingLiteral);
        return valueTemp;
    }

    sysbvm_tuple_t value = SYSBVM_NULL_TUPLE;
    sysbvm_functionBytecodeDirectCompiler_t *compilerObject = (sysbvm_functionBytecodeDirectCompiler_t*)compiler;
    if(!sysbvm_methodDictionary_find(compilerObject->bindingDictionary, binding, &value))
        sysbvm_error("Invalid value binding.");

    return value;
}